

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

void Abc_NtkDontCareSimulateSetElem2(Odc_Man_t *p)

{
  Odc_Lit_t Lit;
  uint *p_00;
  int local_20;
  uint local_1c;
  int k;
  int i;
  uint *pData;
  Odc_Man_t *p_local;
  
  for (local_20 = 0; local_20 < p->nVarsMax; local_20 = local_20 + 1) {
    Lit = Odc_Var(p,local_20);
    p_00 = Odc_ObjTruth(p,Lit);
    Abc_InfoClear(p_00,p->nWords);
    for (local_1c = 0; (int)local_1c < p->nBits; local_1c = local_1c + 1) {
      if ((local_1c & 1 << ((byte)local_20 & 0x1f)) != 0) {
        p_00[(int)local_1c >> 5] = 1 << ((byte)local_1c & 0x1f) | p_00[(int)local_1c >> 5];
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkDontCareSimulateSetElem2( Odc_Man_t * p )
{
    unsigned * pData;
    int i, k;
    for ( k = 0; k < p->nVarsMax; k++ )
    {
        pData = Odc_ObjTruth( p, Odc_Var(p, k) );
        Abc_InfoClear( pData, p->nWords );
        for ( i = 0; i < p->nBits; i++ )
            if ( i & (1 << k) )
                pData[i>>5] |= (1 << (i&31));
    }
}